

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::RuntimeContextInfo::AddWellKnownDebuggerScopePath
          (RuntimeContextInfo *this,RecyclableObject *parent,DebuggerScope *dbgScope,uint32 index)

{
  bool bVar1;
  HeapAllocator *alloc;
  TTAutoString *this_00;
  TrackAllocData local_60;
  TTAutoString *local_38;
  TTAutoString *scpath;
  TTAutoString *ppath;
  DebuggerScope *pDStack_20;
  uint32 index_local;
  DebuggerScope *dbgScope_local;
  RecyclableObject *parent_local;
  RuntimeContextInfo *this_local;
  
  ppath._4_4_ = index;
  pDStack_20 = dbgScope;
  dbgScope_local = (DebuggerScope *)parent;
  parent_local = (RecyclableObject *)this;
  bVar1 = JsUtil::
          BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&this->m_coreDbgScopeToPathMap,&stack0xffffffffffffffe0);
  if (!bVar1) {
    scpath = JsUtil::
             BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::Item(&this->m_coreObjToPathMap,(RecyclableObject **)&dbgScope_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&UtilSupport::TTAutoString::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
               ,0x3b8);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_60);
    this_00 = (TTAutoString *)new<Memory::HeapAllocator>(0x18,alloc,true,0x469be0);
    UtilSupport::TTAutoString::TTAutoString(this_00,scpath);
    local_38 = TTD_MEM_ALLOC_CHECK<TTD::UtilSupport::TTAutoString>(this_00);
    UtilSupport::TTAutoString::Append(local_38,L".!scope[",0,0xffffffffffffffff);
    UtilSupport::TTAutoString::Append(local_38,(ulong)ppath._4_4_);
    UtilSupport::TTAutoString::Append(local_38,L"]",0,0xffffffffffffffff);
    JsUtil::
    BaseDictionary<Js::DebuggerScope_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew(&this->m_coreDbgScopeToPathMap,&stack0xffffffffffffffe0,&local_38);
  }
  return;
}

Assistant:

void RuntimeContextInfo::AddWellKnownDebuggerScopePath(Js::RecyclableObject* parent, Js::DebuggerScope* dbgScope, uint32 index)
    {
        if(!this->m_coreDbgScopeToPathMap.ContainsKey(dbgScope))
        {
            const UtilSupport::TTAutoString* ppath = this->m_coreObjToPathMap.Item(parent);

            UtilSupport::TTAutoString* scpath = TT_HEAP_NEW(UtilSupport::TTAutoString, *ppath);

            scpath->Append(_u(".!scope["));
            scpath->Append(index);
            scpath->Append(_u("]"));

            this->m_coreDbgScopeToPathMap.AddNew(dbgScope, scpath);
        }
    }